

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_fs_scandir_next(uv_fs_t *req,uv_dirent_t *ent)

{
  uint uVar1;
  void *__ptr;
  uv__dirent_t *dent_00;
  uv_dirent_type_t uVar2;
  uint *puVar3;
  uint *nbufs;
  uv__dirent_t *dent;
  uv__dirent_t **dents;
  uv_dirent_t *ent_local;
  uv_fs_t *req_local;
  
  if (req->result < 0) {
    req_local._4_4_ = (int)req->result;
  }
  else if (req->ptr == (void *)0x0) {
    req_local._4_4_ = -0xfff;
  }
  else {
    puVar3 = uv__get_nbufs(req);
    if (puVar3 == (uint *)0x0) {
      __assert_fail("nbufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/uv-common.c"
                    ,0x2d4,"int uv_fs_scandir_next(uv_fs_t *, uv_dirent_t *)");
    }
    __ptr = req->ptr;
    if (*puVar3 != 0) {
      free(*(void **)((long)__ptr + (ulong)(*puVar3 - 1) * 8));
    }
    if (*puVar3 == (uint)req->result) {
      free(__ptr);
      req->ptr = (void *)0x0;
      req_local._4_4_ = -0xfff;
    }
    else {
      uVar1 = *puVar3;
      *puVar3 = uVar1 + 1;
      dent_00 = *(uv__dirent_t **)((long)__ptr + (ulong)uVar1 * 8);
      ent->name = dent_00->d_name;
      uVar2 = uv__fs_get_dirent_type(dent_00);
      ent->type = uVar2;
      req_local._4_4_ = 0;
    }
  }
  return req_local._4_4_;
}

Assistant:

int uv_fs_scandir_next(uv_fs_t* req, uv_dirent_t* ent) {
  uv__dirent_t** dents;
  uv__dirent_t* dent;
  unsigned int* nbufs;

  /* Check to see if req passed */
  if (req->result < 0)
    return req->result;

  /* Ptr will be null if req was canceled or no files found */
  if (!req->ptr)
    return UV_EOF;

  nbufs = uv__get_nbufs(req);
  assert(nbufs);

  dents = req->ptr;

  /* Free previous entity */
  if (*nbufs > 0)
    uv__fs_scandir_free(dents[*nbufs - 1]);

  /* End was already reached */
  if (*nbufs == (unsigned int) req->result) {
    uv__fs_scandir_free(dents);
    req->ptr = NULL;
    return UV_EOF;
  }

  dent = dents[(*nbufs)++];

  ent->name = dent->d_name;
  ent->type = uv__fs_get_dirent_type(dent);

  return 0;
}